

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O3

void __thiscall btSymMatrix<int>::resize(btSymMatrix<int> *this,int n,int *init)

{
  int *ptr;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  this->dim = n;
  iVar6 = (n + 1) * n;
  iVar8 = iVar6 / 2;
  uVar4 = (this->store).m_size;
  if (iVar8 <= (int)uVar4) goto LAB_001e5f74;
  lVar9 = (long)(int)uVar4;
  if ((this->store).m_capacity < iVar8) {
    if (iVar6 + 1U < 3) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)btAlignedAllocInternal((long)iVar8 * 4,0x10);
      uVar4 = (this->store).m_size;
    }
    ptr = (this->store).m_data;
    if ((int)uVar4 < 1) {
      if (ptr != (int *)0x0) goto LAB_001e5e6b;
    }
    else {
      uVar7 = 0;
      do {
        piVar5[uVar7] = ptr[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
LAB_001e5e6b:
      if ((this->store).m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
    }
    (this->store).m_ownsMemory = true;
    (this->store).m_data = piVar5;
    (this->store).m_capacity = iVar8;
  }
  else {
    piVar5 = (this->store).m_data;
  }
  auVar3 = _DAT_001ee5d0;
  auVar2 = _DAT_001ee5c0;
  auVar1 = _DAT_001ee270;
  iVar6 = *init;
  lVar10 = iVar8 - lVar9;
  lVar11 = lVar10 + -1;
  auVar12._8_4_ = (int)lVar11;
  auVar12._0_8_ = lVar11;
  auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
  uVar7 = 0;
  auVar12 = auVar12 ^ _DAT_001ee270;
  do {
    auVar14._8_4_ = (int)uVar7;
    auVar14._0_8_ = uVar7;
    auVar14._12_4_ = (int)(uVar7 >> 0x20);
    auVar15 = (auVar14 | auVar3) ^ auVar1;
    iVar13 = auVar12._4_4_;
    if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ || iVar13 < auVar15._4_4_)
              & 1)) {
      piVar5[lVar9 + uVar7] = iVar6;
    }
    if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
        auVar15._12_4_ <= auVar12._12_4_) {
      piVar5[lVar9 + uVar7 + 1] = iVar6;
    }
    auVar14 = (auVar14 | auVar2) ^ auVar1;
    iVar16 = auVar14._4_4_;
    if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
      piVar5[lVar9 + uVar7 + 2] = iVar6;
      piVar5[lVar9 + uVar7 + 3] = iVar6;
    }
    uVar7 = uVar7 + 4;
  } while ((lVar10 + 3U & 0xfffffffffffffffc) != uVar7);
LAB_001e5f74:
  (this->store).m_size = iVar8;
  return;
}

Assistant:

void					resize(int n,const T& init=T())			{ dim=n;store.resize((n*(n+1))/2,init); }